

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
spirv_cross::SmallVector<Resource,_8UL>::push_back(SmallVector<Resource,_8UL> *this,Resource *t)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t *psVar2;
  char *pcVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  size_t sVar7;
  void *pvVar8;
  pointer pcVar9;
  undefined8 uVar10;
  SPIRVariable *pSVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  ulong uVar15;
  Resource *pRVar16;
  ulong uVar17;
  Resource *pRVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  size_t i;
  ulong uVar20;
  long lVar21;
  
  sVar7 = (this->super_VectorView<Resource>).buffer_size;
  uVar20 = sVar7 + 1;
  if (uVar20 >> 0x3a == 0) {
    uVar17 = this->buffer_capacity;
    if (uVar17 < uVar20) {
      uVar15 = 8;
      if (8 < uVar17) {
        uVar15 = uVar17;
      }
      do {
        uVar17 = uVar15;
        uVar15 = uVar17 * 2;
      } while (uVar17 < uVar20);
      if (uVar17 < 9) {
        pRVar16 = (Resource *)&this->stack_storage;
      }
      else {
        pRVar16 = (Resource *)malloc(uVar17 << 6);
      }
      if (pRVar16 == (Resource *)0x0) goto LAB_002d8abf;
      if ((sVar7 != 0) && (pRVar16 != (this->super_VectorView<Resource>).ptr)) {
        lVar21 = 0x20;
        uVar20 = 0;
        do {
          pcVar3 = (char *)((long)&pRVar16->var + lVar21);
          pRVar18 = (this->super_VectorView<Resource>).ptr;
          puVar4 = (undefined8 *)((long)&pRVar18->var + lVar21);
          puVar5 = (undefined8 *)((long)pRVar18 + lVar21 + -0x20);
          uVar10 = puVar5[1];
          puVar6 = (undefined8 *)((long)pRVar16 + lVar21 + -0x20);
          *puVar6 = *puVar5;
          puVar6[1] = uVar10;
          *(char **)((long)pRVar16 + lVar21 + -0x10) = pcVar3;
          puVar5 = *(undefined8 **)((long)pRVar18 + lVar21 + -0x10);
          if (puVar4 == puVar5) {
            uVar10 = puVar4[1];
            *(undefined8 *)pcVar3 = *puVar4;
            *(undefined8 *)(pcVar3 + 8) = uVar10;
          }
          else {
            *(undefined8 **)((long)pRVar16 + lVar21 + -0x10) = puVar5;
            *(undefined8 *)((long)&pRVar16->var + lVar21) = *puVar4;
          }
          *(undefined8 *)((long)pRVar16 + lVar21 + -8) =
               *(undefined8 *)((long)pRVar18 + lVar21 + -8);
          *(undefined8 **)((long)pRVar18 + lVar21 + -0x10) = puVar4;
          *(undefined8 *)((long)pRVar18 + lVar21 + -8) = 0;
          *(undefined1 *)((long)&pRVar18->var + lVar21) = 0;
          puVar4 = (undefined8 *)((long)&(pRVar18->name)._M_dataplus._M_p + lVar21);
          uVar10 = puVar4[1];
          puVar5 = (undefined8 *)((long)&(pRVar16->name)._M_dataplus._M_p + lVar21);
          *puVar5 = *puVar4;
          puVar5[1] = uVar10;
          pRVar18 = (this->super_VectorView<Resource>).ptr;
          pvVar8 = *(void **)((long)pRVar18 + lVar21 + -0x10);
          if ((void *)((long)&pRVar18->var + lVar21) != pvVar8) {
            operator_delete(pvVar8);
          }
          uVar20 = uVar20 + 1;
          lVar21 = lVar21 + 0x40;
        } while (uVar20 < (this->super_VectorView<Resource>).buffer_size);
      }
      pRVar18 = (this->super_VectorView<Resource>).ptr;
      if (pRVar18 != (Resource *)&this->stack_storage) {
        free(pRVar18);
      }
      (this->super_VectorView<Resource>).ptr = pRVar16;
      this->buffer_capacity = uVar17;
    }
    pRVar16 = (this->super_VectorView<Resource>).ptr;
    sVar7 = (this->super_VectorView<Resource>).buffer_size;
    pSVar11 = t->descriptor_alias;
    pRVar18 = pRVar16 + sVar7;
    paVar19 = &(pRVar18->name).field_2;
    pRVar18->var = t->var;
    pRVar18->descriptor_alias = pSVar11;
    (pRVar18->name)._M_dataplus._M_p = (pointer)paVar19;
    pcVar9 = (t->name)._M_dataplus._M_p;
    paVar1 = &(t->name).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar9 == paVar1) {
      uVar10 = *(undefined8 *)((long)&(t->name).field_2 + 8);
      paVar19->_M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&(pRVar18->name).field_2 + 8) = uVar10;
    }
    else {
      pRVar16[sVar7].name._M_dataplus._M_p = pcVar9;
      pRVar16[sVar7].name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    pRVar16[sVar7].name._M_string_length = (t->name)._M_string_length;
    (t->name)._M_dataplus._M_p = (pointer)paVar1;
    (t->name)._M_string_length = 0;
    (t->name).field_2._M_local_buf[0] = '\0';
    uVar12 = t->index;
    uVar13 = t->plane;
    uVar14 = t->secondary_index;
    pRVar16[sVar7].basetype = t->basetype;
    pRVar16[sVar7].index = uVar12;
    pRVar16[sVar7].plane = uVar13;
    pRVar16[sVar7].secondary_index = uVar14;
    psVar2 = &(this->super_VectorView<Resource>).buffer_size;
    *psVar2 = *psVar2 + 1;
    return;
  }
LAB_002d8abf:
  ::std::terminate();
}

Assistant:

void push_back(T &&t) SPIRV_CROSS_NOEXCEPT
	{
		reserve(this->buffer_size + 1);
		new (&this->ptr[this->buffer_size]) T(std::move(t));
		this->buffer_size++;
	}